

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint64_t roaring_bitmap_range_cardinality_closed
                   (roaring_bitmap_t *r,uint32_t range_start,uint32_t range_end)

{
  uint8_t typecode;
  container_t *c;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint64_t uVar5;
  uint16_t local_34;
  
  if (range_end < range_start) {
    uVar5 = 0;
  }
  else {
    uVar4 = range_end >> 0x10;
    uVar1 = ra_get_index(&r->high_low_container,(uint16_t)(range_start >> 0x10));
    local_34 = (uint16_t)range_end;
    if ((int)uVar1 < 0) {
      uVar1 = ~uVar1;
      uVar5 = 0;
    }
    else {
      c = (r->high_low_container).containers[uVar1];
      typecode = (r->high_low_container).typecodes[uVar1];
      if (range_start >> 0x10 == uVar4) {
        iVar2 = container_rank(c,typecode,local_34);
      }
      else {
        iVar2 = container_get_cardinality(c,typecode);
      }
      uVar5 = (uint64_t)iVar2;
      if ((short)range_start != 0) {
        iVar2 = container_rank((r->high_low_container).containers[uVar1],
                               (r->high_low_container).typecodes[uVar1],(short)range_start - 1);
        uVar5 = uVar5 - (long)iVar2;
      }
      uVar1 = uVar1 + 1;
    }
    for (uVar3 = (ulong)uVar1; (int)uVar3 < (r->high_low_container).size; uVar3 = uVar3 + 1) {
      uVar1 = (uint)(r->high_low_container).keys[uVar3];
      if (uVar4 <= uVar1) {
        if (uVar4 != uVar1) {
          return uVar5;
        }
        iVar2 = container_rank((r->high_low_container).containers[uVar3],
                               (r->high_low_container).typecodes[uVar3],local_34);
        return uVar5 + (long)iVar2;
      }
      iVar2 = container_get_cardinality
                        ((r->high_low_container).containers[uVar3],
                         (r->high_low_container).typecodes[uVar3]);
      uVar5 = uVar5 + (long)iVar2;
    }
  }
  return uVar5;
}

Assistant:

uint64_t roaring_bitmap_range_cardinality_closed(const roaring_bitmap_t *r,
                                                 uint32_t range_start,
                                                 uint32_t range_end) {
    const roaring_array_t *ra = &r->high_low_container;

    if (range_start > range_end) {
        return 0;
    }

    // now we have: 0 <= range_start <= range_end <= UINT32_MAX

    uint16_t minhb = (uint16_t)(range_start >> 16);
    uint16_t maxhb = (uint16_t)(range_end >> 16);

    uint64_t card = 0;

    int i = ra_get_index(ra, minhb);
    if (i >= 0) {
        if (minhb == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
        } else {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        }
        if ((range_start & 0xffff) != 0) {
            card -= container_rank(ra->containers[i], ra->typecodes[i],
                                   (range_start & 0xffff) - 1);
        }
        i++;
    } else {
        i = -i - 1;
    }

    for (; i < ra->size; i++) {
        uint16_t key = ra->keys[i];
        if (key < maxhb) {
            card +=
                container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        } else if (key == maxhb) {
            card += container_rank(ra->containers[i], ra->typecodes[i],
                                   range_end & 0xffff);
            break;
        } else {
            break;
        }
    }

    return card;
}